

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vx-sound.c
# Opt level: O3

void ALCheckForErrors(void)

{
  int iVar1;
  
  iVar1 = alGetError();
  if (iVar1 != 0) {
    ALCheckForErrors_cold_1();
  }
  return;
}

Assistant:

void ALCheckForErrors() {
    ALCenum error = alGetError();
    if (error != ALC_NO_ERROR) {
        fprintf(stderr, "An error occurred!\n");
        switch (error) {
            case ALC_INVALID_VALUE:
                fprintf(stderr, "ALC_INVALID_VALUE: an invalid value was passed to an OpenAL function");
                break;
            case ALC_INVALID_DEVICE:
                fprintf(stderr, "ALC_INVALID_DEVICE: a bad device was passed to an OpenAL function");
                break;
            case ALC_INVALID_CONTEXT:
                fprintf(stderr, "ALC_INVALID_CONTEXT: a bad context was passed to an OpenAL function");
                break;
            case ALC_INVALID_ENUM:
                fprintf(stderr, "ALC_INVALID_ENUM: an unknown enum value was passed to an OpenAL function");
                break;
            case ALC_OUT_OF_MEMORY:
                fprintf(stderr, "ALC_OUT_OF_MEMORY: an unknown enum value was passed to an OpenAL function");
                break;
            default:
                fprintf(stderr, "UNKNOWN ALC ERROR");
        }
        fprintf(stderr, "\n");
    }
}